

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_chmod(uv_loop_t *loop,uv_fs_t *req,char *path,int mode,uv_fs_cb cb)

{
  char *pcVar1;
  uv_fs_cb cb_local;
  int mode_local;
  char *path_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->type = UV_FS;
    req->active_queue[0] = loop->active_reqs;
    req->active_queue[1] = loop->active_reqs[1];
    *(void ***)req->active_queue[1] = req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  req->fs_type = UV_FS_CHMOD;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  if (path != (char *)0x0) {
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
    }
    else {
      pcVar1 = uv__strdup(path);
      req->path = pcVar1;
      if (req->path == (char *)0x0) {
        if (loop->active_reqs != (void **)loop->active_reqs[0]) {
          *(void **)req->active_queue[1] = req->active_queue[0];
          *(void **)((long)req->active_queue[0] + 8) = req->active_queue[1];
          return -0xc;
        }
        __assert_fail("uv__has_active_reqs(loop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                      ,0x40a,"int uv_fs_chmod(uv_loop_t *, uv_fs_t *, const char *, int, uv_fs_cb)")
        ;
      }
    }
    req->mode = mode;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      loop_local._4_4_ = (int)req->result;
    }
    else {
      uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
      loop_local._4_4_ = 0;
    }
    return loop_local._4_4_;
  }
  __assert_fail("path != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                ,0x40a,"int uv_fs_chmod(uv_loop_t *, uv_fs_t *, const char *, int, uv_fs_cb)");
}

Assistant:

int uv_fs_chmod(uv_loop_t* loop,
                uv_fs_t* req,
                const char* path,
                int mode,
                uv_fs_cb cb) {
  INIT(CHMOD);
  PATH;
  req->mode = mode;
  POST;
}